

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O0

void scsp_write_ram(void *info,UINT32 offset,UINT32 length,UINT8 *data)

{
  scsp_state *scsp;
  UINT8 *data_local;
  UINT32 length_local;
  UINT32 offset_local;
  void *info_local;
  
  if (offset < *(uint *)((long)info + 0x1460)) {
    data_local._0_4_ = length;
    if (*(uint *)((long)info + 0x1460) < offset + length) {
      data_local._0_4_ = *(int *)((long)info + 0x1460) - offset;
    }
    memcpy((void *)(*(long *)((long)info + 0x1458) + (ulong)offset),data,(ulong)(UINT32)data_local);
  }
  return;
}

Assistant:

static void scsp_write_ram(void* info, UINT32 offset, UINT32 length, const UINT8* data)
{
	scsp_state *scsp = (scsp_state *)info;
	
	if (offset >= scsp->SCSPRAM_LENGTH)
		return;
	if (offset + length > scsp->SCSPRAM_LENGTH)
		length = scsp->SCSPRAM_LENGTH - offset;
	
	memcpy(scsp->SCSPRAM + offset, data, length);
	
	return;
}